

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_bspline_basis(REF_INT degree,REF_DBL *knots,REF_DBL t,REF_INT span,REF_DBL *N)

{
  double dVar1;
  double dVar2;
  REF_STATUS RVar3;
  undefined8 uVar4;
  double *pdVar5;
  double *pdVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  REF_DBL RVar13;
  double dVar14;
  double dVar15;
  REF_DBL right [16];
  REF_DBL left [16];
  double adStack_138 [16];
  double adStack_b8 [17];
  
  if (degree < 0x10) {
    *N = 1.0;
    if (degree < 1) {
      RVar3 = 0;
    }
    else {
      uVar9 = 1;
      pdVar5 = adStack_b8;
      do {
        pdVar5 = pdVar5 + 1;
        adStack_b8[uVar9] = t - knots[(span + 1) - (int)uVar9];
        adStack_138[uVar9] = knots[(long)span + uVar9] - t;
        uVar8 = 0;
        dVar12 = 0.0;
        pdVar6 = pdVar5;
        do {
          dVar1 = adStack_138[uVar8 + 1];
          dVar2 = *pdVar6;
          dVar14 = dVar1 + dVar2;
          dVar15 = dVar14 * 1e+20;
          if (dVar15 <= -dVar15) {
            dVar15 = -dVar15;
          }
          dVar10 = N[uVar8];
          RVar13 = -dVar10;
          dVar11 = dVar10;
          if (dVar10 <= RVar13) {
            dVar11 = RVar13;
          }
          if (dVar15 <= dVar11) {
            printf("N[%d] %f l %f r %f\n",uVar8 & 0xffffffff);
            dVar10 = N[uVar8];
            RVar13 = -dVar10;
          }
          if (dVar15 <= (double)(~-(ulong)(0.0 < dVar10) & (ulong)RVar13 |
                                -(ulong)(0.0 < dVar10) & (ulong)dVar10)) {
            pcVar7 = "right+left is zero";
            uVar4 = 0x109f;
            goto LAB_00158091;
          }
          dVar10 = dVar10 / dVar14;
          N[uVar8] = dVar1 * dVar10 + dVar12;
          uVar8 = uVar8 + 1;
          dVar12 = dVar2 * dVar10;
          pdVar6 = pdVar6 + -1;
        } while (uVar9 != uVar8);
        N[uVar9] = dVar12;
        uVar9 = uVar9 + 1;
        RVar3 = 0;
      } while (uVar9 != degree + 1);
    }
  }
  else {
    pcVar7 = "temp variables sized smaller than degree";
    uVar4 = 0x1094;
LAB_00158091:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
           "ref_geom_bspline_basis",pcVar7);
    RVar3 = 1;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_basis(REF_INT degree, REF_DBL *knots,
                                          REF_DBL t, REF_INT span, REF_DBL *N) {
  REF_INT j, r;
  REF_DBL left[16];
  REF_DBL right[16];
  REF_DBL saved, temp;
  RAS(degree < 16, "temp variables sized smaller than degree");
  N[0] = 1.0;
  for (j = 1; j <= degree; j++) {
    left[j] = t - knots[span + 1 - j];
    right[j] = knots[span + j] - t;
    saved = 0.0;
    for (r = 0; r < j; r++) {
      if (!ref_math_divisible(N[r], (right[r + 1] + left[j - r]))) {
        printf("N[%d] %f l %f r %f\n", r, N[r], right[r + 1], left[j - r]);
      }
      RAS(ref_math_divisible(N[r], (right[r + 1] + left[j - r])),
          "right+left is zero");
      temp = N[r] / (right[r + 1] + left[j - r]);
      N[r] = saved + right[r + 1] * temp;
      saved = left[j - r] * temp;
    }
    N[j] = saved;
  }
  return REF_SUCCESS;
}